

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O3

void * __thiscall embree::BVHN<4>::Allocator::operator()(Allocator *this,size_t bytes)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  FastAllocator *this_00;
  pointer *pppTVar3;
  BVHN<4> *pBVar4;
  ThreadLocal2 *this_01;
  iterator __position;
  void *pvVar5;
  MutexSys MVar6;
  long *plVar7;
  ThreadLocal2 *this_02;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  Lock<embree::MutexSys> lock;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_50;
  char local_48;
  MutexSys local_40;
  undefined1 local_38;
  MutexSys local_30;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_28;
  
  plVar7 = (long *)__tls_get_addr(&PTR_021a7d38);
  this_02 = (ThreadLocal2 *)*plVar7;
  if (this_02 == (ThreadLocal2 *)0x0) {
    this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_02);
    (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_02->alloc0).parent = this_02;
    (this_02->alloc0).ptr = (char *)0x0;
    (this_02->alloc0).cur = 0;
    (this_02->alloc0).end = 0;
    (this_02->alloc0).allocBlockSize = 0;
    (this_02->alloc0).bytesUsed = 0;
    (this_02->alloc0).bytesWasted = 0;
    (this_02->alloc1).parent = this_02;
    (this_02->alloc1).ptr = (char *)0x0;
    (this_02->alloc1).cur = 0;
    (this_02->alloc1).end = 0;
    (this_02->alloc1).allocBlockSize = 0;
    (this_02->alloc1).bytesUsed = 0;
    (this_02->alloc1).bytesWasted = 0;
    *plVar7 = (long)this_02;
    local_40.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_38 = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_50._M_head_impl = this_02;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_50);
    if (local_50._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_50,
                 local_50._M_head_impl);
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
  }
  pBVar4 = this->bvh;
  this_00 = &pBVar4->alloc;
  this_01 = (this_02->alloc0).parent;
  local_30.mutex = (void *)bytes;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_48 = '\x01';
    local_50._M_head_impl = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    (this_01->alloc1).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_40.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_38 = 1;
    local_28._M_head_impl = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pBVar4->alloc).thread_local_allocators.
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(pBVar4->alloc).thread_local_allocators,__position,&local_28._M_head_impl);
    }
    else {
      *__position._M_current = this_01;
      pppTVar3 = &(pBVar4->alloc).thread_local_allocators.
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_48 == '\x01') {
      MutexSys::unlock(&(local_50._M_head_impl)->mutex);
    }
  }
  MVar6.mutex = local_30.mutex;
  psVar1 = &(this_02->alloc0).bytesUsed;
  *psVar1 = *psVar1 + (long)local_30.mutex;
  sVar10 = (this_02->alloc0).cur;
  uVar11 = (ulong)(-(int)sVar10 & 0xf);
  uVar8 = (long)local_30.mutex + uVar11 + sVar10;
  (this_02->alloc0).cur = uVar8;
  if ((this_02->alloc0).end < uVar8) {
    (this_02->alloc0).cur = sVar10;
    pvVar5 = (void *)(this_02->alloc0).allocBlockSize;
    if (local_30.mutex * 4 < pvVar5 || (long)(local_30.mutex * 4) - (long)pvVar5 == 0) {
      local_40.mutex = pvVar5;
      pcVar9 = (char *)FastAllocator::malloc(this_00,(size_t)&local_40);
      (this_02->alloc0).ptr = pcVar9;
      sVar10 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
      (this_02->alloc0).bytesWasted = sVar10;
      (this_02->alloc0).end = (size_t)local_40.mutex;
      (this_02->alloc0).cur = (size_t)MVar6.mutex;
      if (local_40.mutex < MVar6.mutex) {
        (this_02->alloc0).cur = 0;
        local_40.mutex = (void *)(this_02->alloc0).allocBlockSize;
        pcVar9 = (char *)FastAllocator::malloc(this_00,(size_t)&local_40);
        (this_02->alloc0).ptr = pcVar9;
        sVar10 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
        (this_02->alloc0).bytesWasted = sVar10;
        (this_02->alloc0).end = (size_t)local_40.mutex;
        (this_02->alloc0).cur = (size_t)MVar6.mutex;
        if (local_40.mutex < MVar6.mutex) {
          (this_02->alloc0).cur = 0;
          return (void *)0x0;
        }
      }
      (this_02->alloc0).bytesWasted = sVar10;
    }
    else {
      pcVar9 = (char *)FastAllocator::malloc(this_00,(size_t)&local_30);
    }
  }
  else {
    psVar1 = &(this_02->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar11;
    pcVar9 = (this_02->alloc0).ptr + (uVar8 - (long)local_30.mutex);
  }
  return pcVar9;
}

Assistant:

__forceinline void* operator() (size_t bytes) const { 
        return bvh->alloc._threadLocal()->malloc(&bvh->alloc,bytes); 
      }